

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-config.c
# Opt level: O1

void ndn_security_init(void)

{
  ndn_rng_backend_t *pnVar1;
  
  ndn_lite_default_sha_load_backend();
  ndn_lite_default_aes_load_backend();
  ndn_lite_default_ecc_load_backend();
  ndn_lite_default_hmac_load_backend();
  ndn_lite_default_rng_load_backend();
  if (platform_security_init != (_func_void *)0x0) {
    (*platform_security_init)();
  }
  pnVar1 = ndn_rng_get_backend();
  ndn_ecc_set_rng(pnVar1->rng);
  return;
}

Assistant:

void
ndn_security_init(void)
{
  // SHA256 backend
  ndn_lite_default_sha_load_backend();

  // AES backend
  ndn_lite_default_aes_load_backend();

  // ECC backend
  ndn_lite_default_ecc_load_backend();

  // HMAC backend
  ndn_lite_default_hmac_load_backend();

  // RNG fake backend
  ndn_lite_default_rng_load_backend();

  if (platform_security_init != NULL) {
    platform_security_init();
  }

  ndn_ecc_set_rng(ndn_rng_get_backend()->rng);
}